

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

void __thiscall
despot::BaseTag::MostLikelyOpponentPosition
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  pointer ppSVar1;
  pointer piVar2;
  State *pSVar3;
  pointer pdVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  allocator_type local_11;
  
  if ((MostLikelyOpponentPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)
       ::probs == '\0') && (iVar5 = __cxa_guard_acquire(), iVar5 != 0)) {
    iVar5 = despot::Floor::NumCells();
    std::vector<double,_std::allocator<double>_>::vector
              (&MostLikelyOpponentPosition::probs,(long)iVar5,&local_11);
    __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,
                 &MostLikelyOpponentPosition::probs,&__dso_handle);
    __cxa_guard_release();
  }
  pdVar4 = MostLikelyOpponentPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 3;
    piVar2 = (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      pSVar3 = ppSVar1[lVar7];
      iVar5 = piVar2[*(int *)(pSVar3 + 0xc)];
      pdVar4[iVar5] = *(double *)(pSVar3 + 0x18) + pdVar4[iVar5];
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  if ((long)MostLikelyOpponentPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4 != 0) {
    lVar6 = (long)MostLikelyOpponentPosition::probs.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
    dVar8 = 0.0;
    lVar7 = 0;
    do {
      if (dVar8 < pdVar4[lVar7]) {
        dVar8 = pdVar4[lVar7];
      }
      pdVar4[lVar7] = 0.0;
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  despot::Floor::GetCell((int)this + 0x58);
  return;
}

Assistant:

Coord BaseTag::MostLikelyOpponentPosition(
	const vector<State*>& particles) const {
	static vector<double> probs = vector<double>(floor_.NumCells());

	for (int i = 0; i < particles.size(); i++) {
		TagState* tagstate = static_cast<TagState*>(particles[i]);
		probs[opp_[tagstate->state_id]] += tagstate->weight;
	}

	double maxWeight = 0;
	int opp = -1;
	for (int i = 0; i < probs.size(); i++) {
		if (probs[i] > maxWeight) {
			maxWeight = probs[i];
			opp = i;
		}
		probs[i] = 0.0;
	}

	return floor_.GetCell(opp);
}